

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

cmServerResponse * __thiscall
cmServerProtocol1::ProcessSetGlobalSettings
          (cmServerResponse *__return_storage_ptr__,cmServerProtocol1 *this,cmServerRequest *request
          )

{
  bool bVar1;
  Value *pVVar2;
  long *plVar3;
  cmake *pcVar4;
  long lVar5;
  pointer key;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  boolValues;
  _Any_data local_148;
  undefined1 local_138 [16];
  cmGlobalGeneratorFactory **local_128;
  cmGlobalGeneratorFactory *local_118 [2];
  cmGlobalGenerator *local_108 [2];
  undefined1 local_f8 [16];
  _Base_ptr local_e8;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  long *local_88 [2];
  long local_78 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_148._M_unused._M_object = local_138;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,kDEBUG_OUTPUT_KEY_abi_cxx11_._M_dataplus._M_p,
             kDEBUG_OUTPUT_KEY_abi_cxx11_._M_dataplus._M_p +
             kDEBUG_OUTPUT_KEY_abi_cxx11_._M_string_length);
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,kTRACE_KEY_abi_cxx11_._M_dataplus._M_p,
             kTRACE_KEY_abi_cxx11_._M_dataplus._M_p + kTRACE_KEY_abi_cxx11_._M_string_length);
  local_108[0] = (cmGlobalGenerator *)local_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,kTRACE_EXPAND_KEY_abi_cxx11_._M_dataplus._M_p,
             kTRACE_EXPAND_KEY_abi_cxx11_._M_dataplus._M_p +
             kTRACE_EXPAND_KEY_abi_cxx11_._M_string_length);
  local_e8 = (_Base_ptr)local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,kWARN_UNINITIALIZED_KEY_abi_cxx11_._M_dataplus._M_p,
             kWARN_UNINITIALIZED_KEY_abi_cxx11_._M_dataplus._M_p +
             kWARN_UNINITIALIZED_KEY_abi_cxx11_._M_string_length);
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,kWARN_UNUSED_KEY_abi_cxx11_._M_dataplus._M_p,
             kWARN_UNUSED_KEY_abi_cxx11_._M_dataplus._M_p +
             kWARN_UNUSED_KEY_abi_cxx11_._M_string_length);
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_a8,kWARN_UNUSED_CLI_KEY_abi_cxx11_._M_dataplus._M_p,
             kWARN_UNUSED_CLI_KEY_abi_cxx11_._M_dataplus._M_p +
             kWARN_UNUSED_CLI_KEY_abi_cxx11_._M_string_length);
  plVar3 = local_78;
  local_88[0] = plVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,kCHECK_SYSTEM_VARS_KEY_abi_cxx11_._M_dataplus._M_p,
             kCHECK_SYSTEM_VARS_KEY_abi_cxx11_._M_dataplus._M_p +
             kCHECK_SYSTEM_VARS_KEY_abi_cxx11_._M_string_length);
  __l._M_len = 7;
  __l._M_array = (iterator)&local_148;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,(allocator_type *)&local_68);
  lVar5 = -0xe0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key = local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      pVVar2 = Json::Value::operator[](&request->Data,key);
      bVar1 = Json::Value::isNull(pVVar2);
      if (!bVar1) {
        pVVar2 = Json::Value::operator[](&request->Data,key);
        bVar1 = Json::Value::isBool(pVVar2);
        if (!bVar1) {
          std::operator+(&local_68,"\"",key);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
          local_148._M_unused._M_object = local_138;
          pcVar4 = (cmake *)(plVar3 + 2);
          if ((cmake *)*plVar3 == pcVar4) {
            local_138._0_8_ =
                 (pcVar4->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_138._8_8_ = plVar3[3];
          }
          else {
            local_138._0_8_ =
                 (pcVar4->Generators).
                 super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_148._M_unused._M_object = (cmake *)*plVar3;
          }
          local_148._8_8_ = plVar3[1];
          *plVar3 = (long)pcVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          cmServerRequest::ReportError(__return_storage_ptr__,request,(string *)&local_148);
          if ((cmake *)local_148._M_unused._0_8_ != (cmake *)local_138) {
            operator_delete(local_148._M_unused._M_object,local_138._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          goto LAB_003a595d;
        }
      }
      key = key + 1;
    } while (key != local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar4 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
           super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
           super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
           super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  local_148._8_8_ = 0;
  local_138._8_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:675:11)>
       ::_M_invoke;
  local_138._0_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:675:11)>
       ::_M_manager;
  local_148._M_unused._M_object = pcVar4;
  setBool(request,&kDEBUG_OUTPUT_KEY_abi_cxx11_,(function<void_(bool)> *)&local_148);
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    (*(code *)local_138._0_8_)(&local_148,&local_148,3);
  }
  local_148._8_8_ = 0;
  local_138._8_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:676:32)>
       ::_M_invoke;
  local_138._0_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:676:32)>
       ::_M_manager;
  local_148._M_unused._M_object = pcVar4;
  setBool(request,&kTRACE_KEY_abi_cxx11_,(function<void_(bool)> *)&local_148);
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    (*(code *)local_138._0_8_)(&local_148,&local_148,3);
  }
  local_148._8_8_ = 0;
  local_138._8_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:677:39)>
       ::_M_invoke;
  local_138._0_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:677:39)>
       ::_M_manager;
  local_148._M_unused._M_object = pcVar4;
  setBool(request,&kTRACE_EXPAND_KEY_abi_cxx11_,(function<void_(bool)> *)&local_148);
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    (*(code *)local_138._0_8_)(&local_148,&local_148,3);
  }
  local_148._8_8_ = 0;
  local_138._8_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:679:11)>
       ::_M_invoke;
  local_138._0_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:679:11)>
       ::_M_manager;
  local_148._M_unused._M_object = pcVar4;
  setBool(request,&kWARN_UNINITIALIZED_KEY_abi_cxx11_,(function<void_(bool)> *)&local_148);
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    (*(code *)local_138._0_8_)(&local_148,&local_148,3);
  }
  local_148._8_8_ = 0;
  local_138._8_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:680:38)>
       ::_M_invoke;
  local_138._0_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:680:38)>
       ::_M_manager;
  local_148._M_unused._M_object = pcVar4;
  setBool(request,&kWARN_UNUSED_KEY_abi_cxx11_,(function<void_(bool)> *)&local_148);
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    (*(code *)local_138._0_8_)(&local_148,&local_148,3);
  }
  local_148._8_8_ = 0;
  local_138._8_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:682:11)>
       ::_M_invoke;
  local_138._0_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:682:11)>
       ::_M_manager;
  local_148._M_unused._M_object = pcVar4;
  setBool(request,&kWARN_UNUSED_CLI_KEY_abi_cxx11_,(function<void_(bool)> *)&local_148);
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    (*(code *)local_138._0_8_)(&local_148,&local_148,3);
  }
  local_148._8_8_ = 0;
  local_138._8_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:684:11)>
       ::_M_invoke;
  local_138._0_8_ =
       std::
       _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServerProtocol.cxx:684:11)>
       ::_M_manager;
  local_148._M_unused._M_object = pcVar4;
  setBool(request,&kCHECK_SYSTEM_VARS_KEY_abi_cxx11_,(function<void_(bool)> *)&local_148);
  if ((pointer)local_138._0_8_ != (pointer)0x0) {
    (*(code *)local_138._0_8_)(&local_148,&local_148,3);
  }
  Json::Value::Value((Value *)&local_148,nullValue);
  cmServerRequest::Reply(__return_storage_ptr__,request,(Value *)&local_148);
  Json::Value::~Value((Value *)&local_148);
LAB_003a595d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

cmServerResponse cmServerProtocol1::ProcessSetGlobalSettings(
  const cmServerRequest& request)
{
  const std::vector<std::string> boolValues = {
    kDEBUG_OUTPUT_KEY,       kTRACE_KEY,       kTRACE_EXPAND_KEY,
    kWARN_UNINITIALIZED_KEY, kWARN_UNUSED_KEY, kWARN_UNUSED_CLI_KEY,
    kCHECK_SYSTEM_VARS_KEY
  };
  for (std::string const& i : boolValues) {
    if (!request.Data[i].isNull() && !request.Data[i].isBool()) {
      return request.ReportError("\"" + i +
                                 "\" must be unset or a bool value.");
    }
  }

  cmake* cm = this->CMakeInstance();

  setBool(request, kDEBUG_OUTPUT_KEY,
          [cm](bool e) { cm->SetDebugOutputOn(e); });
  setBool(request, kTRACE_KEY, [cm](bool e) { cm->SetTrace(e); });
  setBool(request, kTRACE_EXPAND_KEY, [cm](bool e) { cm->SetTraceExpand(e); });
  setBool(request, kWARN_UNINITIALIZED_KEY,
          [cm](bool e) { cm->SetWarnUninitialized(e); });
  setBool(request, kWARN_UNUSED_KEY, [cm](bool e) { cm->SetWarnUnused(e); });
  setBool(request, kWARN_UNUSED_CLI_KEY,
          [cm](bool e) { cm->SetWarnUnusedCli(e); });
  setBool(request, kCHECK_SYSTEM_VARS_KEY,
          [cm](bool e) { cm->SetCheckSystemVars(e); });

  return request.Reply(Json::Value());
}